

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O0

CMStringPosPointers * __thiscall
ConfusableMatcher::ComputeStringPosPointers(ConfusableMatcher *this,string *Contains)

{
  byte bVar1;
  bool bVar2;
  CMStringPosPointers *this_00;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  pointer ppVar6;
  long lVar7;
  pointer ppVar8;
  long lVar9;
  CMStringView CVar10;
  pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>
  local_98;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  __normal_iterator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_*,_std::vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>_>
  local_68;
  __normal_iterator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_*,_std::vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>_>
  local_60;
  iterator keyIterator;
  vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
  *keyArr;
  vector<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
  vec;
  int x;
  CMStringPosPointers *ret;
  string *Contains_local;
  ConfusableMatcher *this_local;
  
  this_00 = (CMStringPosPointers *)operator_new(0x18);
  memset(this_00,0,0x18);
  CMStringPosPointers::CMStringPosPointers(this_00);
  vec.
  super__Vector_base<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    uVar3 = (ulong)vec.
                   super__Vector_base<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= uVar3) break;
    std::
    vector<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
    ::vector((vector<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
              *)&keyArr);
    pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)Contains);
    bVar1 = *pbVar5;
    local_60._M_current =
         (pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>
          *)std::
            vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
            ::begin(this->TheMap + bVar1);
    while( true ) {
      local_68._M_current =
           (pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>
            *)std::
              vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
              ::end(this->TheMap + bVar1);
      bVar2 = __gnu_cxx::operator!=(&local_60,&local_68);
      if (!bVar2) break;
      ppVar6 = __gnu_cxx::
               __normal_iterator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_*,_std::vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>_>
               ::operator->(&local_60);
      uVar3 = (ppVar6->first).Len;
      lVar7 = std::__cxx11::string::size();
      if (uVar3 <= (ulong)(lVar7 - vec.
                                   super__Vector_base<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
        ppVar6 = __gnu_cxx::
                 __normal_iterator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_*,_std::vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>_>
                 ::operator->(&local_60);
        CVar10 = CMString::View(&ppVar6->first);
        local_78 = CVar10;
        lVar7 = std::__cxx11::string::data();
        lVar9 = (long)vec.
                      super__Vector_base<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        ppVar6 = __gnu_cxx::
                 __normal_iterator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_*,_std::vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>_>
                 ::operator->(&local_60);
        std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
        basic_string_view(&local_88,(char *)(lVar7 + lVar9),(ppVar6->first).Len);
        bVar2 = std::experimental::fundamentals_v1::operator!=(local_78,local_88);
        if (!bVar2) {
          ppVar6 = __gnu_cxx::
                   __normal_iterator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_*,_std::vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>_>
                   ::operator->(&local_60);
          ppVar8 = __gnu_cxx::
                   __normal_iterator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_*,_std::vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>_>
                   ::operator->(&local_60);
          std::
          pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>
          ::
          pair<unsigned_long_&,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*&,_true>
                    (&local_98,&(ppVar6->first).Len,&ppVar8->second);
          std::
          vector<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
          ::push_back((vector<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                       *)&keyArr,&local_98);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_*,_std::vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>_>
      ::operator++(&local_60,0);
    }
    std::
    vector<std::vector<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>_>_>
    ::push_back((vector<std::vector<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>_>_>
                 *)this_00,(value_type *)&keyArr);
    std::
    vector<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
    ::~vector((vector<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               *)&keyArr);
    vec.
    super__Vector_base<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         vec.
         super__Vector_base<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<unsigned_long,_const_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  return this_00;
}

Assistant:

CMStringPosPointers *ConfusableMatcher::ComputeStringPosPointers(std::string Contains)
{
	auto ret = new CMStringPosPointers();

	// Loop for each char
	for (auto x = 0;x < Contains.size();x++) {
		std::vector<std::pair<size_t /* Key len */, const CMInnerHashMap*>> vec;

		auto &keyArr = TheMap[(unsigned char)Contains[x]];

		// Find and put all inner hashmaps, together with key substring length
		for (auto keyIterator = keyArr.begin();keyIterator != keyArr.end();keyIterator++) {
			if (keyIterator->first.Len > Contains.size() - x || (keyIterator->first).View() != CMStringView(Contains.data() + x, keyIterator->first.Len))
				continue;

			vec.push_back(std::pair<size_t, const CMInnerHashMap*>(keyIterator->first.Len, keyIterator->second));
		}

		// Puts at `x` pos
		ret->PosPointers.push_back(vec);
	}

	return ret;
}